

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *ds,QLocale *l)

{
  QSharedDataPointer<QLocalePrivate> QVar1;
  long in_FS_OFFSET;
  QLocale local_40;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  operator>>(ds,&local_38);
  QLocale::QLocale(&local_40,&local_38);
  QVar1.d.ptr = (totally_ordered_wrapper<QLocalePrivate_*>)(l->d).d.ptr;
  (l->d).d.ptr = (QLocalePrivate *)local_40;
  local_40.d.d.ptr =
       (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)QVar1.d.ptr;
  QLocale::~QLocale(&local_40);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return ds;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &ds, QLocale &l)
{
    QString s;
    ds >> s;
    l = QLocale(s);
    return ds;
}